

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::applications_pool::_data::attachment::attachment
          (attachment *this,shared_ptr<cppcms::application_specific_pool> *p,mount_point *m)

{
  shared_ptr<cppcms::application_specific_pool> *in_RSI;
  shared_ptr<cppcms::application_specific_pool> *in_RDI;
  mount_point *in_stack_00000008;
  
  mount_point::mount_point(m,in_stack_00000008);
  std::shared_ptr<cppcms::application_specific_pool>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

attachment(booster::shared_ptr<application_specific_pool> p,mount_point const &m) : mp(m), pool(p) {}